

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

ostream * __thiscall
covenant::DFA<covenant::Sym>::print_dot(DFA<covenant::Sym> *this,ostream *o,string *label)

{
  Sym s;
  pointer pvVar1;
  const_reference cVar2;
  ostream *poVar3;
  type this_00;
  pointer pvVar4;
  char *pcVar5;
  int i;
  size_type __n;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  string local_50;
  
  print_dot::sfa_key = print_dot::sfa_key + 1;
  poVar3 = std::operator<<(o,"digraph ");
  poVar3 = std::operator<<(poVar3,"sfa_");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"{");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(o,"label = \"");
  poVar3 = std::operator<<(poVar3,(string *)label);
  poVar3 = std::operator<<(poVar3,"\";");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(o,"rankdir=LR;");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(o,"node [shape = point ] qi;");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (__n = 0; (long)__n <
                (long)(int)(((long)(this->trans).
                                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->trans).
                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1)
  {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->accepts,__n);
    pcVar5 = "node [shape = circle ] ";
    if (cVar2) {
      pcVar5 = "node [shape = doublecircle ] ";
    }
    poVar3 = std::operator<<(o,pcVar5);
    poVar3 = std::operator<<(poVar3,"q");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)__n);
    poVar3 = std::operator<<(poVar3,";");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<(o,"qi");
  poVar3 = std::operator<<(poVar3," -> ");
  poVar3 = std::operator<<(poVar3,"q");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    pvVar4 = (this->trans).
             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar7)
    break;
    for (uVar8 = 0; uVar9 = (ulong)uVar8,
        uVar9 < (ulong)((long)*(pointer *)
                               ((long)&pvVar4[uVar7].
                                       super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&pvVar4[uVar7].
                                  super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                  ._M_impl.super__Vector_impl_data >> 3); uVar8 = uVar8 + 1) {
      poVar3 = std::operator<<(o,"q");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," -> ");
      poVar3 = std::operator<<(poVar3,"q");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," [label=\"");
      s.x = *(int *)(*(long *)&(this->trans).
                               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar7].
                               super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                               ._M_impl.super__Vector_impl_data + uVar9 * 8);
      if ((s.x & 1U) == 0) {
        this_00 = boost::shared_ptr<covenant::TerminalFactory>::operator->(&this->_tfac);
        TerminalFactory::remap_abi_cxx11_
                  (&local_50,this_00,
                   (long)(*(int *)(*(long *)&(this->trans).
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                             super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                             ._M_impl.super__Vector_impl_data + uVar9 * 8) >> 1));
        std::operator<<(o,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        operator<<(o,s);
      }
      poVar3 = std::operator<<(o,"\"];");
      std::endl<char,std::char_traits<char>>(poVar3);
      pvVar4 = (this->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (uVar8 = 0;
        pvVar1 = (this->eps).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar8 <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data >> 2); uVar8 = uVar8 + 1) {
      poVar3 = std::operator<<(o,"q");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," -> ");
      poVar3 = std::operator<<(poVar3,"q");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)(*(long *)&(this->eps).
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + (ulong)uVar8 * 4
                                         ));
      poVar3 = std::operator<<(poVar3," [label=e];");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar6 = uVar6 + 1;
  }
  poVar3 = std::operator<<(o,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  return o;
}

Assistant:

ostream& print_dot(ostream& o, string label) const
    {
      static unsigned int sfa_key=0;
      sfa_key++;
      o << "digraph " << "sfa_" << sfa_key << "{" << endl;
      o << "label = \"" << label << "\";" << endl;
      o << "rankdir=LR;" << endl;
      o << "node [shape = point ] qi;" << endl;
      for (int i=0; i < nStates() ; i++)
      {
        if (accepts[i])
          o << "node [shape = doublecircle ] " << "q" << i << ";" << endl;
        else
          o << "node [shape = circle ] " << "q" << i << ";" << endl;
      }
      o << "qi" << " -> " << "q" << startState().id << endl;
      for( unsigned int ss = 0; ss < trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < trans[ss].size(); ti++ )
        {
          o << "q" << ss << " -> " << "q" << trans[ss][ti].dest 
            << " [label=\"";
          if (trans[ss][ti].val.isVar ())
            o << trans[ss][ti].val; 
          else
            o << _tfac->remap (trans[ss][ti].val.symID ());
          o << "\"];" << endl;
        }
        for(unsigned int ei = 0; ei < eps[ss].size(); ei++)
        {
          o << "q" << ss << " -> " << "q" << eps[ss][ei] 
            << " [label=e];" << endl;
        }
      }
      o << "}" << endl;
      return o;
    }